

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_auth_final_resp(connectdata *conn,int imapcode,imapstate instate)

{
  SessionHandle *data;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  if (imapcode == 0x4f) {
    state(conn,IMAP_STOP);
  }
  else {
    Curl_failf(conn->data,"Authentication failed: %d",(ulong)(uint)imapcode);
    data._4_4_ = CURLE_LOGIN_DENIED;
  }
  return data._4_4_;
}

Assistant:

static CURLcode imap_state_auth_final_resp(struct connectdata *conn,
                                           int imapcode,
                                           imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;

  (void)instate; /* no use for this yet */

  if(imapcode != 'O') {
    failf(data, "Authentication failed: %d", imapcode);
    result = CURLE_LOGIN_DENIED;
  }
  else
    /* End of connect phase */
    state(conn, IMAP_STOP);

  return result;
}